

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* makeBlankGrid(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *__return_storage_ptr__,int size)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> row;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = 0;
  if (size < 1) {
    size = 0;
  }
  for (; iVar2 != size; iVar2 = iVar2 + 1) {
    iVar1 = size;
    if (local_48._M_impl.super__Vector_impl_data._M_finish !=
        local_48._M_impl.super__Vector_impl_data._M_start) {
      local_48._M_impl.super__Vector_impl_data._M_finish =
           local_48._M_impl.super__Vector_impl_data._M_start;
    }
    while (iVar1 != 0) {
      local_4c = 0;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_48,&local_4c);
      iVar1 = iVar1 + -1;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_48);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

vector<vector<int>> makeBlankGrid(int size) {
    vector<vector<int>> grid;
    vector<int> row;
    for (int cols = 0; cols < size; cols++) {
        row.clear();
        for (int rows = 0; rows < size; rows++) {
            row.push_back(0);
        }
        grid.push_back(row);
    }
    return grid;
}